

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O3

HRESULT __thiscall
Js::JavascriptExceptionContext::StackFrame::GetFunctionNameWithArguments
          (StackFrame *this,LPCWSTR *outResult)

{
  FunctionBody *pFVar1;
  HRESULT HVar2;
  anon_union_8_2_4da9e1e4_for_StackFrame_1 functionName;
  ScriptContext *scriptContext;
  
  pFVar1 = (this->functionBody).ptr;
  if (pFVar1 == (FunctionBody *)0x0) {
    functionName = this->field_1;
  }
  else {
    functionName = (anon_union_8_2_4da9e1e4_for_StackFrame_1)
                   ParseableFunctionInfo::GetExternalDisplayName
                             (&pFVar1->super_ParseableFunctionInfo);
    pFVar1 = (this->functionBody).ptr;
    if (pFVar1 != (FunctionBody *)0x0) {
      scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)pFVar1);
      HVar2 = StackTraceArguments::ToString
                        (&this->argumentTypes,(LPCWSTR)functionName,scriptContext,outResult);
      return HVar2;
    }
  }
  *outResult = (LPCWSTR)functionName;
  return 0;
}

Assistant:

HRESULT JavascriptExceptionContext::StackFrame::GetFunctionNameWithArguments(_In_ LPCWSTR *outResult) const
    {
        PCWSTR name = GetFunctionName();
        HRESULT hr = S_OK;
        if (IsScriptFunction())
        {
            hr = argumentTypes.ToString(name, functionBody->GetScriptContext(), outResult);
        }
        else
        {
            *outResult = name;
        }

        return hr;
    }